

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlLoadDrawQuad(void)

{
  long lVar1;
  undefined8 *puVar2;
  float *pfVar3;
  uint quadVBO;
  uint quadVAO;
  float vertices [20];
  
  quadVAO = 0;
  quadVBO = 0;
  puVar2 = &DAT_00154bd0;
  pfVar3 = vertices;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pfVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    pfVar3 = pfVar3 + 2;
  }
  (*glad_glGenVertexArrays)(1,&quadVAO);
  (*glad_glBindVertexArray)(quadVAO);
  (*glad_glGenBuffers)(1,&quadVBO);
  (*glad_glBindBuffer)(0x8892,quadVBO);
  (*glad_glBufferData)(0x8892,0x50,vertices,0x88e4);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0x14,(void *)0x0);
  (*glad_glEnableVertexAttribArray)(1);
  (*glad_glVertexAttribPointer)(1,2,0x1406,'\0',0x14,(void *)0xc);
  (*glad_glBindVertexArray)(quadVAO);
  (*glad_glDrawArrays)(5,0,4);
  (*glad_glBindVertexArray)(0);
  (*glad_glDeleteBuffers)(1,&quadVBO);
  (*glad_glDeleteVertexArrays)(1,&quadVAO);
  return;
}

Assistant:

void rlLoadDrawQuad(void)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    unsigned int quadVAO = 0;
    unsigned int quadVBO = 0;

    float vertices[] = {
         // Positions         Texcoords
        -1.0f,  1.0f, 0.0f,   0.0f, 1.0f,
        -1.0f, -1.0f, 0.0f,   0.0f, 0.0f,
         1.0f,  1.0f, 0.0f,   1.0f, 1.0f,
         1.0f, -1.0f, 0.0f,   1.0f, 0.0f,
    };

    // Gen VAO to contain VBO
    glGenVertexArrays(1, &quadVAO);
    glBindVertexArray(quadVAO);

    // Gen and fill vertex buffer (VBO)
    glGenBuffers(1, &quadVBO);
    glBindBuffer(GL_ARRAY_BUFFER, quadVBO);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), &vertices, GL_STATIC_DRAW);

    // Bind vertex attributes (position, texcoords)
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 5*sizeof(float), (void *)0); // Positions
    glEnableVertexAttribArray(1);
    glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 5*sizeof(float), (void *)(3*sizeof(float))); // Texcoords

    // Draw quad
    glBindVertexArray(quadVAO);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
    glBindVertexArray(0);

    // Delete buffers (VBO and VAO)
    glDeleteBuffers(1, &quadVBO);
    glDeleteVertexArrays(1, &quadVAO);
#endif
}